

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimage.cpp
# Opt level: O0

QImage * __thiscall QImage::operator=(QImage *this,QImage *image)

{
  QImageData *pQVar1;
  bool bVar2;
  QImage *in_RSI;
  QImage *in_RDI;
  long in_FS_OFFSET;
  QImageData *in_stack_ffffffffffffffb0;
  QImage local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QPaintDevice::paintingActive(&in_RSI->super_QPaintDevice);
  if (bVar2) {
    QRect::QRect((QRect *)in_RSI);
    copy(&local_20,(QRect *)in_RSI);
    operator=(in_RDI,in_RSI);
    ~QImage(in_RSI);
  }
  else {
    if (in_RSI->d != (QImageData *)0x0) {
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x2bcf77);
    }
    if (((in_RDI->d != (QImageData *)0x0) &&
        (bVar2 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x2bcf91), !bVar2)) &&
       (pQVar1 = in_RDI->d, pQVar1 != (QImageData *)0x0)) {
      QImageData::~QImageData(in_stack_ffffffffffffffb0);
      operator_delete(pQVar1,0xa0);
    }
    in_RDI->d = in_RSI->d;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QImage &QImage::operator=(const QImage &image)
{
    if (image.paintingActive()) {
        operator=(image.copy());
    } else {
        if (image.d)
            image.d->ref.ref();
        if (d && !d->ref.deref())
            delete d;
        d = image.d;
    }
    return *this;
}